

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

void charactersDebug(void *ctx,xmlChar *ch,int len)

{
  uint uVar1;
  char output [40];
  undefined1 local_38 [40];
  ulong __n;
  
  callbacks = callbacks + 1;
  if (len < 1) {
    __n = 0;
  }
  else {
    uVar1 = 0x1d;
    if (len - 1U < 0x1d) {
      uVar1 = len - 1U;
    }
    __n = (ulong)(uVar1 + 1);
    memcpy(local_38,ch,__n);
  }
  local_38[__n] = 0;
  fprintf((FILE *)SAXdebug,"SAX.characters(%s, %d)\n",local_38,(ulong)(uint)len);
  return;
}

Assistant:

static void
charactersDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *ch, int len)
{
    char output[40];
    int i;

    callbacks++;
    if (quiet)
	return;
    for (i = 0;(i<len) && (i < 30);i++)
	output[i] = (char) ch[i];
    output[i] = 0;

    fprintf(SAXdebug, "SAX.characters(%s, %d)\n", output, len);
}